

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<int> __thiscall Omega_h::subtract_each<int>(Omega_h *this,Read<int> *a,Read<int> *b)

{
  Alloc *pAVar1;
  Alloc *pAVar2;
  ulong uVar3;
  void *extraout_RDX;
  ulong uVar4;
  size_t sVar5;
  Read<int> RVar6;
  Write<int> c;
  type f;
  allocator local_71;
  Write<int> local_70;
  Write<int> local_60;
  type local_50;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar4 = pAVar1->size;
  }
  else {
    uVar4 = (ulong)pAVar1 >> 3;
  }
  pAVar2 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar3 = pAVar2->size;
  }
  else {
    uVar3 = (ulong)pAVar2 >> 3;
  }
  if ((int)(uVar4 >> 2) == (int)(uVar3 >> 2)) {
    if (((ulong)pAVar1 & 1) == 0) {
      sVar5 = pAVar1->size;
    }
    else {
      sVar5 = (ulong)pAVar1 >> 3;
    }
    std::__cxx11::string::string((string *)&local_50,"",&local_71);
    Write<int>::Write(&local_70,(LO)(sVar5 >> 2),(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    Write<int>::Write((Write<int> *)&local_50,&local_70);
    Write<int>::Write((Write<int> *)&local_50.a,&a->write_);
    Write<int>::Write((Write<int> *)&local_50.b,&b->write_);
    if (((ulong)local_70.shared_alloc_.alloc & 1) == 0) {
      uVar4 = (local_70.shared_alloc_.alloc)->size;
    }
    else {
      uVar4 = (ulong)local_70.shared_alloc_.alloc >> 3;
    }
    parallel_for<Omega_h::subtract_each<int>(Omega_h::Read<int>,Omega_h::Read<int>)::_lambda(int)_1_>
              ((LO)(uVar4 >> 2),&local_50,"subtract_each");
    Write<int>::Write(&local_60,&local_70);
    Read<int>::Read((Read<signed_char> *)this,&local_60);
    Write<int>::~Write(&local_60);
    subtract_each<int>(Omega_h::Read<int>,Omega_h::Read<int>)::{lambda(int)#1}::~Read
              ((_lambda_int__1_ *)&local_50);
    Write<int>::~Write(&local_70);
    RVar6.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<int>)RVar6.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0xbf);
}

Assistant:

Read<T> subtract_each(Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = a[i] - b[i]; };
  parallel_for(c.size(), f, "subtract_each");
  return c;
}